

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O0

void __thiscall NumberTemp::NumberTemp(NumberTemp *this,JitArenaAllocator *alloc,bool inLoop)

{
  HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *local_58;
  bool inLoop_local;
  JitArenaAllocator *alloc_local;
  NumberTemp *this_local;
  
  TempTrackerBase::TempTrackerBase(&this->super_TempTrackerBase,alloc,inLoop);
  this->nonTempElemLoad = false;
  BVSparse<Memory::JitArenaAllocator>::BVSparse(&this->elemLoadDependencies,alloc);
  this->upwardExposedMarkTempObjectSymsProperties =
       (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0;
  BVSparse<Memory::JitArenaAllocator>::BVSparse(&this->upwardExposedMarkTempObjectLiveFields,alloc);
  if (inLoop) {
    local_58 = HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::New
                         (&alloc->super_ArenaAllocator,0x10);
  }
  else {
    local_58 = (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0;
  }
  this->propertyIdsTempTransferDependencies = local_58;
  return;
}

Assistant:

NumberTemp::NumberTemp(JitArenaAllocator * alloc, bool inLoop)
    : TempTrackerBase(alloc, inLoop), elemLoadDependencies(alloc), nonTempElemLoad(false),
      upwardExposedMarkTempObjectLiveFields(alloc), upwardExposedMarkTempObjectSymsProperties(nullptr)
{
    propertyIdsTempTransferDependencies = inLoop ? HashTable<BVSparse<JitArenaAllocator> *>::New(alloc, 16) : nullptr;
}